

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecx_meth.c
# Opt level: O0

int validate_ecx_derive(EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen,uchar **privkey,uchar **pubkey)

{
  EVP_PKEY *pk;
  char *func;
  undefined8 *in_RCX;
  long in_RDI;
  long *in_R8;
  ECX_KEY *peerkey;
  ECX_KEY *ecxkey;
  char *in_stack_ffffffffffffffc0;
  EVP_PKEY *in_stack_ffffffffffffffc8;
  int local_4;
  
  if ((*(long *)(in_RDI + 0x88) == 0) || (*(long *)(in_RDI + 0x90) == 0)) {
    ERR_new();
    ERR_set_debug((char *)in_R8,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                  in_stack_ffffffffffffffc0);
    ERR_set_error(0x10,0x8c,(char *)0x0);
    local_4 = 0;
  }
  else {
    pk = (EVP_PKEY *)evp_pkey_get_legacy(in_stack_ffffffffffffffc8);
    func = (char *)evp_pkey_get_legacy(pk);
    if ((pk == (EVP_PKEY *)0x0) || ((pk->ex_data).ctx == (OSSL_LIB_CTX *)0x0)) {
      ERR_new();
      ERR_set_debug((char *)in_R8,(int)((ulong)pk >> 0x20),func);
      ERR_set_error(0x10,0x7b,(char *)0x0);
      local_4 = 0;
    }
    else if (func == (char *)0x0) {
      ERR_new();
      ERR_set_debug((char *)in_R8,(int)((ulong)pk >> 0x20),func);
      ERR_set_error(0x10,0x85,(char *)0x0);
      local_4 = 0;
    }
    else {
      *in_RCX = (pk->ex_data).ctx;
      *in_R8 = (long)(func + 0x11);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int validate_ecx_derive(EVP_PKEY_CTX *ctx, unsigned char *key,
                                          size_t *keylen,
                                          const unsigned char **privkey,
                                          const unsigned char **pubkey)
{
    const ECX_KEY *ecxkey, *peerkey;

    if (ctx->pkey == NULL || ctx->peerkey == NULL) {
        ERR_raise(ERR_LIB_EC, EC_R_KEYS_NOT_SET);
        return 0;
    }
    ecxkey = evp_pkey_get_legacy(ctx->pkey);
    peerkey = evp_pkey_get_legacy(ctx->peerkey);
    if (ecxkey == NULL || ecxkey->privkey == NULL) {
        ERR_raise(ERR_LIB_EC, EC_R_INVALID_PRIVATE_KEY);
        return 0;
    }
    if (peerkey == NULL) {
        ERR_raise(ERR_LIB_EC, EC_R_INVALID_PEER_KEY);
        return 0;
    }
    *privkey = ecxkey->privkey;
    *pubkey = peerkey->pubkey;

    return 1;
}